

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::ModfCaseInstance::getInputValues
          (ModfCaseInstance *this,int numValues,void **values)

{
  pointer pSVar1;
  deUint32 dVar2;
  int iVar3;
  int in_ECX;
  ulong uVar4;
  Random rnd;
  float local_48 [6];
  deRandom local_30;
  
  local_48[0] = -2.0;
  local_48[1] = 2.0;
  local_48[2] = -1000.0;
  local_48[3] = 1000.0;
  local_48[4] = -1e+07;
  local_48[5] = 1e+07;
  dVar2 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_30,dVar2 ^ 0xac23f);
  pSVar1 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (ulong)*(uint *)((long)&(pSVar1->varType).m_data + 4);
  iVar3 = glu::getDataTypeScalarSize((pSVar1->varType).m_data.basic.type);
  fillRandomScalars<float>
            ((Random *)&local_30,local_48[uVar4 * 2],local_48[uVar4 * 2 + 1],*values,
             numValues * iVar3,in_ECX);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd			(deStringHash(m_name) ^ 0xac23fu);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), values[0], numValues*scalarSize);
	}